

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::SetupWriteAutogenInfo(cmQtAutoGenInitializer *this)

{
  size_type sVar1;
  MUFile *pMVar2;
  cmGeneratorTarget *pcVar3;
  long lVar4;
  pointer ppMVar5;
  pointer pbVar6;
  cmMakefile *makefile;
  ulong uVar7;
  string *value;
  pointer filePath;
  pointer ppMVar8;
  char *pcVar9;
  char cVar10;
  uint uVar11;
  __normal_iterator<const_cmQtAutoGenInitializer::MUFile_**,_std::vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>_>
  __i;
  long lVar12;
  __node_base *p_Var13;
  pointer ppMVar14;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar15;
  anon_class_8_1_ea5e79e8 MfDef;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  sortedHeaders;
  MUFile *pMStack_4e8;
  uint local_4dc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourcesFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headersFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  string err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headersBuildPaths;
  string path;
  string basePath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_skip;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_skip;
  InfoWriter ofs;
  string local_50;
  
  InfoWriter::InfoWriter(&ofs,&(this->AutogenTarget).InfoFile);
  uVar11 = *(uint *)(&ofs.Ofs_.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      field_0x20 +
                    (long)ofs.Ofs_.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>
                          ._vptr_basic_ostream[-3]);
  if ((uVar11 & 5) == 0) {
    makefile = cmTarget::GetMakefile(this->Target->Target);
    MfDef.makefile = makefile;
    std::operator<<((ostream *)&ofs,"# Meta\n");
    pcVar9 = "FALSE";
    if (this->MultiConfig != false) {
      pcVar9 = "TRUE";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,pcVar9,(allocator<char> *)&sortedHeaders);
    InfoWriter::Write(&ofs,"AM_MULTI_CONFIG",&err);
    std::__cxx11::string::~string((string *)&err);
    InfoWriter::Write(&ofs,"AM_PARALLEL",&(this->AutogenTarget).Parallel);
    InfoWriter::Write(&ofs,"AM_VERBOSITY",&this->Verbosity);
    std::operator<<((ostream *)&ofs,"# Directories\n");
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_(&err,&MfDef,"CMAKE_SOURCE_DIR");
    InfoWriter::Write(&ofs,"AM_CMAKE_SOURCE_DIR",&err);
    std::__cxx11::string::~string((string *)&err);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_(&err,&MfDef,"CMAKE_BINARY_DIR");
    InfoWriter::Write(&ofs,"AM_CMAKE_BINARY_DIR",&err);
    std::__cxx11::string::~string((string *)&err);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_(&err,&MfDef,"CMAKE_CURRENT_SOURCE_DIR");
    InfoWriter::Write(&ofs,"AM_CMAKE_CURRENT_SOURCE_DIR",&err);
    std::__cxx11::string::~string((string *)&err);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_(&err,&MfDef,"CMAKE_CURRENT_BINARY_DIR");
    InfoWriter::Write(&ofs,"AM_CMAKE_CURRENT_BINARY_DIR",&err);
    std::__cxx11::string::~string((string *)&err);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              (&err,&MfDef,"CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE");
    InfoWriter::Write(&ofs,"AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",&err);
    std::__cxx11::string::~string((string *)&err);
    InfoWriter::Write(&ofs,"AM_BUILD_DIR",&(this->Dir).Build);
    InfoWriter::Write(&ofs,"AM_INCLUDE_DIR",&(this->Dir).Include);
    InfoWriter::WriteConfig(&ofs,"AM_INCLUDE_DIR",&(this->Dir).ConfigInclude);
    headers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    headersFlags.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    headersBuildPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    headers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    headers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    headersFlags.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    headersFlags.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sourcesFlags.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    moc_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &moc_skip._M_t._M_impl.super__Rb_tree_header._M_header;
    moc_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    moc_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    moc_skip._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uic_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &uic_skip._M_t._M_impl.super__Rb_tree_header._M_header;
    uic_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    headersBuildPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    headersBuildPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uic_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    sources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sourcesFlags.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sourcesFlags.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uic_skip._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    sVar1 = (this->AutogenTarget).Headers._M_h._M_element_count;
    uic_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         uic_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    moc_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         moc_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&headers,sVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&headersFlags,sVar1);
    sortedHeaders.
    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sortedHeaders.
    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sortedHeaders.
    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ::reserve(&sortedHeaders,sVar1);
    p_Var13 = &(this->AutogenTarget).Headers._M_h._M_before_begin;
    while (ppMVar8 = sortedHeaders.
                     super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
          ppMVar5 = sortedHeaders.
                    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                    ._M_impl.super__Vector_impl_data._M_start, p_Var13 = p_Var13->_M_nxt,
          p_Var13 != (__node_base *)0x0) {
      err._M_dataplus._M_p =
           *(pointer *)&((_Prime_rehash_policy *)(p_Var13 + 2))->_M_max_load_factor;
      std::
      vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
      ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                ((vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
                  *)&sortedHeaders,(MUFile **)&err);
    }
    if (sortedHeaders.
        super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        sortedHeaders.
        super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar12 = (long)sortedHeaders.
                     super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)sortedHeaders.
                     super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = lVar12 >> 3;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                (sortedHeaders.
                 super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 sortedHeaders.
                 super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar12 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                  (ppMVar5,ppMVar8);
      }
      else {
        ppMVar14 = ppMVar5 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                  (ppMVar5,ppMVar14);
        for (; ppMVar14 != ppMVar8; ppMVar14 = ppMVar14 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                    (ppMVar14);
        }
      }
    }
    ppMVar5 = sortedHeaders.
              super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_4dc = uVar11;
    for (ppMVar8 = sortedHeaders.
                   super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppMVar8 != ppMVar5;
        ppMVar8 = ppMVar8 + 1) {
      pMVar2 = *ppMVar8;
      if ((pMVar2->Generated != true) || (this->CMP0071Accept == true)) {
        if (pMVar2->SkipMoc == true) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&moc_skip,&pMVar2->RealPath);
        }
        if (pMVar2->SkipUic == true) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&uic_skip,&pMVar2->RealPath);
        }
        if ((pMVar2->MocIt != false) || (pMVar2->UicIt == true)) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&headers,
                     &pMVar2->RealPath);
          err._M_dataplus._M_p = (pointer)&err.field_2;
          err._M_string_length = 0;
          err.field_2._M_local_buf[0] = '\0';
          cVar10 = (char)&err;
          std::__cxx11::string::push_back(cVar10);
          std::__cxx11::string::push_back(cVar10);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &headersFlags,&err);
          std::__cxx11::string::~string((string *)&err);
        }
      }
    }
    std::
    _Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ::~_Vector_base(&sortedHeaders.
                     super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   );
    cmFilePathChecksum::cmFilePathChecksum((cmFilePathChecksum *)&err,makefile);
    pbVar6 = headers.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sortedHeaders.
    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ._M_impl.super__Vector_impl_data._M_start = &pMStack_4e8;
    sortedHeaders.
    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
    sortedHeaders.
    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pMStack_4e8 = (MUFile *)0x0;
    for (filePath = headers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; filePath != pbVar6;
        filePath = filePath + 1) {
      cmFilePathChecksum::getPart(&basePath,(cmFilePathChecksum *)&err,filePath,10);
      std::__cxx11::string::append((char *)&basePath);
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&path,filePath);
      std::__cxx11::string::append((string *)&basePath);
      std::__cxx11::string::~string((string *)&path);
      for (uVar11 = 1; uVar11 != 0x400; uVar11 = uVar11 + 1) {
        std::__cxx11::string::string((string *)&path,(string *)&basePath);
        if (1 < uVar11) {
          std::__cxx11::string::push_back((char)&path);
          std::__cxx11::to_string(&local_50,uVar11);
          std::__cxx11::string::append((string *)&path);
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::__cxx11::string::append((char *)&path);
        pVar15 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<std::__cxx11::string&>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&sortedHeaders,&path);
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &headersBuildPaths,&path);
          std::__cxx11::string::~string((string *)&path);
          break;
        }
        std::__cxx11::string::~string((string *)&path);
      }
      std::__cxx11::string::~string((string *)&basePath);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&sortedHeaders);
    std::
    array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
    ::~array((array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
              *)&err);
    sVar1 = (this->AutogenTarget).Sources._M_h._M_element_count;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&sources,sVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&sourcesFlags,sVar1);
    sortedHeaders.
    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sortedHeaders.
    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sortedHeaders.
    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ::reserve(&sortedHeaders,sVar1);
    p_Var13 = &(this->AutogenTarget).Sources._M_h._M_before_begin;
    while (ppMVar8 = sortedHeaders.
                     super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
          ppMVar5 = sortedHeaders.
                    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                    ._M_impl.super__Vector_impl_data._M_start, p_Var13 = p_Var13->_M_nxt,
          p_Var13 != (__node_base *)0x0) {
      err._M_dataplus._M_p =
           *(pointer *)&((_Prime_rehash_policy *)(p_Var13 + 2))->_M_max_load_factor;
      std::
      vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
      ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                ((vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
                  *)&sortedHeaders,(MUFile **)&err);
    }
    if (sortedHeaders.
        super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        sortedHeaders.
        super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar12 = (long)sortedHeaders.
                     super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)sortedHeaders.
                     super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = lVar12 >> 3;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                (sortedHeaders.
                 super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 sortedHeaders.
                 super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar12 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                  (ppMVar5,ppMVar8);
      }
      else {
        ppMVar14 = ppMVar5 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                  (ppMVar5,ppMVar14);
        for (; ppMVar14 != ppMVar8; ppMVar14 = ppMVar14 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                    (ppMVar14);
        }
      }
    }
    ppMVar5 = sortedHeaders.
              super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppMVar8 = sortedHeaders.
                   super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppMVar8 != ppMVar5;
        ppMVar8 = ppMVar8 + 1) {
      pMVar2 = *ppMVar8;
      if ((pMVar2->Generated != true) || (this->CMP0071Accept == true)) {
        if (pMVar2->SkipMoc == true) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&moc_skip,&pMVar2->RealPath);
        }
        if (pMVar2->SkipUic == true) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&uic_skip,&pMVar2->RealPath);
        }
        if ((pMVar2->MocIt != false) || (pMVar2->UicIt == true)) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sources,
                     &pMVar2->RealPath);
          err._M_dataplus._M_p = (pointer)&err.field_2;
          err._M_string_length = 0;
          err.field_2._M_local_buf[0] = '\0';
          cVar10 = (char)&err;
          std::__cxx11::string::push_back(cVar10);
          std::__cxx11::string::push_back(cVar10);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &sourcesFlags,&err);
          std::__cxx11::string::~string((string *)&err);
        }
      }
    }
    std::
    _Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ::~_Vector_base(&sortedHeaders.
                     super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   );
    std::operator<<((ostream *)&ofs,"# Qt\n");
    uVar11 = local_4dc;
    InfoWriter::WriteUInt(&ofs,"AM_QT_VERSION_MAJOR",(this->QtVersion).Major);
    InfoWriter::Write(&ofs,"AM_QT_MOC_EXECUTABLE",&(this->Moc).super_GenVarsT.Executable);
    InfoWriter::Write(&ofs,"AM_QT_UIC_EXECUTABLE",&(this->Uic).super_GenVarsT.Executable);
    std::operator<<((ostream *)&ofs,"# Files\n");
    value = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    InfoWriter::Write(&ofs,"AM_CMAKE_EXECUTABLE",value);
    InfoWriter::Write(&ofs,"AM_SETTINGS_FILE",&(this->AutogenTarget).SettingsFile);
    InfoWriter::WriteConfig(&ofs,"AM_SETTINGS_FILE",&(this->AutogenTarget).ConfigSettingsFile);
    InfoWriter::Write(&ofs,"AM_PARSE_CACHE_FILE",&(this->AutogenTarget).ParseCacheFile);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&ofs,"AM_HEADERS",&headers);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&ofs,"AM_HEADERS_FLAGS",&headersFlags);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&ofs,"AM_HEADERS_BUILD_PATHS",&headersBuildPaths);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&ofs,"AM_SOURCES",&sources);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&ofs,"AM_SOURCES_FLAGS",&sourcesFlags);
    if ((this->Moc).super_GenVarsT.Enabled == true) {
      std::operator<<((ostream *)&ofs,"# MOC settings\n");
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                (&ofs,"AM_MOC_SKIP",&moc_skip);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                (&ofs,"AM_MOC_DEFINITIONS",&(this->Moc).Defines);
      InfoWriter::
      WriteConfigStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                (&ofs,"AM_MOC_DEFINITIONS",&(this->Moc).ConfigDefines);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&ofs,"AM_MOC_INCLUDES",&(this->Moc).Includes);
      InfoWriter::
      WriteConfigStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&ofs,"AM_MOC_INCLUDES",&(this->Moc).ConfigIncludes);
      pcVar3 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sortedHeaders,"AUTOMOC_MOC_OPTIONS",(allocator<char> *)&basePath);
      pcVar9 = cmGeneratorTarget::GetSafeProperty(pcVar3,(string *)&sortedHeaders);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&err,pcVar9,(allocator<char> *)&path);
      InfoWriter::Write(&ofs,"AM_MOC_OPTIONS",&err);
      std::__cxx11::string::~string((string *)&err);
      std::__cxx11::string::~string((string *)&sortedHeaders);
      SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_(&err,&MfDef,"CMAKE_AUTOMOC_RELAXED_MODE");
      InfoWriter::Write(&ofs,"AM_MOC_RELAXED_MODE",&err);
      std::__cxx11::string::~string((string *)&err);
      pcVar3 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sortedHeaders,"AUTOMOC_MACRO_NAMES",(allocator<char> *)&basePath);
      pcVar9 = cmGeneratorTarget::GetSafeProperty(pcVar3,(string *)&sortedHeaders);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&err,pcVar9,(allocator<char> *)&path);
      InfoWriter::Write(&ofs,"AM_MOC_MACRO_NAMES",&err);
      std::__cxx11::string::~string((string *)&err);
      std::__cxx11::string::~string((string *)&sortedHeaders);
      pcVar3 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sortedHeaders,"AUTOMOC_DEPEND_FILTERS",(allocator<char> *)&basePath);
      pcVar9 = cmGeneratorTarget::GetSafeProperty(pcVar3,(string *)&sortedHeaders);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&err,pcVar9,(allocator<char> *)&path);
      InfoWriter::Write(&ofs,"AM_MOC_DEPEND_FILTERS",&err);
      std::__cxx11::string::~string((string *)&err);
      std::__cxx11::string::~string((string *)&sortedHeaders);
      InfoWriter::Write(&ofs,"AM_MOC_PREDEFS_CMD",&(this->Moc).PredefsCmd);
    }
    if ((this->Uic).super_GenVarsT.Enabled == true) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&uic_skip,
                 (this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )&(this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header);
      std::operator<<((ostream *)&ofs,"# UIC settings\n");
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                (&ofs,"AM_UIC_SKIP",&uic_skip);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&ofs,"AM_UIC_TARGET_OPTIONS",&(this->Uic).Options);
      InfoWriter::
      WriteConfigStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&ofs,"AM_UIC_TARGET_OPTIONS",&(this->Uic).ConfigOptions);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&ofs,"AM_UIC_OPTIONS_FILES",&(this->Uic).FileFiles);
      InfoWriter::WriteNestedLists(&ofs,"AM_UIC_OPTIONS_OPTIONS",&(this->Uic).FileOptions);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&ofs,"AM_UIC_SEARCH_PATHS",&(this->Uic).SearchPaths);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&uic_skip._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&moc_skip._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sourcesFlags);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sources);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&headersBuildPaths);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&headersFlags);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&headers);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"AutoGen: Could not write file ",(allocator<char> *)&sortedHeaders);
    std::__cxx11::string::append((string *)&err);
    cmSystemTools::Error(&err);
    std::__cxx11::string::~string((string *)&err);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ofs.Ofs_);
  return (uVar11 & 5) == 0;
}

Assistant:

bool cmQtAutoGenInitializer::SetupWriteAutogenInfo()
{
  InfoWriter ofs(this->AutogenTarget.InfoFile);
  if (ofs) {
    // Utility lambdas
    cmMakefile* makefile = this->Target->Target->GetMakefile();
    auto MfDef = [makefile](const char* key) {
      return makefile->GetSafeDefinition(key);
    };

    // Write common settings
    ofs.Write("# Meta\n");
    ofs.Write("AM_MULTI_CONFIG", this->MultiConfig ? "TRUE" : "FALSE");
    ofs.Write("AM_PARALLEL", this->AutogenTarget.Parallel);
    ofs.Write("AM_VERBOSITY", this->Verbosity);

    ofs.Write("# Directories\n");
    ofs.Write("AM_CMAKE_SOURCE_DIR", MfDef("CMAKE_SOURCE_DIR"));
    ofs.Write("AM_CMAKE_BINARY_DIR", MfDef("CMAKE_BINARY_DIR"));
    ofs.Write("AM_CMAKE_CURRENT_SOURCE_DIR",
              MfDef("CMAKE_CURRENT_SOURCE_DIR"));
    ofs.Write("AM_CMAKE_CURRENT_BINARY_DIR",
              MfDef("CMAKE_CURRENT_BINARY_DIR"));
    ofs.Write("AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",
              MfDef("CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE"));
    ofs.Write("AM_BUILD_DIR", this->Dir.Build);
    ofs.Write("AM_INCLUDE_DIR", this->Dir.Include);
    ofs.WriteConfig("AM_INCLUDE_DIR", this->Dir.ConfigInclude);

    std::vector<std::string> headers;
    std::vector<std::string> headersFlags;
    std::vector<std::string> headersBuildPaths;
    std::vector<std::string> sources;
    std::vector<std::string> sourcesFlags;
    std::set<std::string> moc_skip;
    std::set<std::string> uic_skip;

    // Filter headers
    {
      auto headerCount = this->AutogenTarget.Headers.size();
      headers.reserve(headerCount);
      headersFlags.reserve(headerCount);

      std::vector<MUFile const*> sortedHeaders;
      {
        sortedHeaders.reserve(headerCount);
        for (auto const& pair : this->AutogenTarget.Headers) {
          sortedHeaders.emplace_back(pair.second.get());
        }
        std::sort(sortedHeaders.begin(), sortedHeaders.end(),
                  [](MUFile const* a, MUFile const* b) {
                    return (a->RealPath < b->RealPath);
                  });
      }

      for (MUFile const* const muf : sortedHeaders) {
        if (muf->Generated && !this->CMP0071Accept) {
          continue;
        }
        if (muf->SkipMoc) {
          moc_skip.insert(muf->RealPath);
        }
        if (muf->SkipUic) {
          uic_skip.insert(muf->RealPath);
        }
        if (muf->MocIt || muf->UicIt) {
          headers.emplace_back(muf->RealPath);
          std::string flags;
          flags += muf->MocIt ? 'M' : 'm';
          flags += muf->UicIt ? 'U' : 'u';
          headersFlags.emplace_back(std::move(flags));
        }
      }
    }
    // Header build paths
    {
      cmFilePathChecksum const fpathCheckSum(makefile);
      std::unordered_set<std::string> emitted;
      for (std::string const& hdr : headers) {
        std::string basePath = fpathCheckSum.getPart(hdr);
        basePath += "/moc_";
        basePath += cmSystemTools::GetFilenameWithoutLastExtension(hdr);
        for (unsigned int ii = 1; ii != 1024; ++ii) {
          std::string path = basePath;
          if (ii > 1) {
            path += '_';
            path += std::to_string(ii);
          }
          path += ".cpp";
          if (emitted.emplace(path).second) {
            headersBuildPaths.emplace_back(std::move(path));
            break;
          }
        }
      }
    }

    // Filter sources
    {
      auto sourcesCount = this->AutogenTarget.Sources.size();
      sources.reserve(sourcesCount);
      sourcesFlags.reserve(sourcesCount);

      std::vector<MUFile const*> sorted;
      sorted.reserve(sourcesCount);
      for (auto const& pair : this->AutogenTarget.Sources) {
        sorted.emplace_back(pair.second.get());
      }
      std::sort(sorted.begin(), sorted.end(),
                [](MUFile const* a, MUFile const* b) {
                  return (a->RealPath < b->RealPath);
                });

      for (MUFile const* const muf : sorted) {
        if (muf->Generated && !this->CMP0071Accept) {
          continue;
        }
        if (muf->SkipMoc) {
          moc_skip.insert(muf->RealPath);
        }
        if (muf->SkipUic) {
          uic_skip.insert(muf->RealPath);
        }
        if (muf->MocIt || muf->UicIt) {
          sources.emplace_back(muf->RealPath);
          std::string flags;
          flags += muf->MocIt ? 'M' : 'm';
          flags += muf->UicIt ? 'U' : 'u';
          sourcesFlags.emplace_back(std::move(flags));
        }
      }
    }

    ofs.Write("# Qt\n");
    ofs.WriteUInt("AM_QT_VERSION_MAJOR", this->QtVersion.Major);
    ofs.Write("AM_QT_MOC_EXECUTABLE", this->Moc.Executable);
    ofs.Write("AM_QT_UIC_EXECUTABLE", this->Uic.Executable);

    ofs.Write("# Files\n");
    ofs.Write("AM_CMAKE_EXECUTABLE", cmSystemTools::GetCMakeCommand());
    ofs.Write("AM_SETTINGS_FILE", this->AutogenTarget.SettingsFile);
    ofs.WriteConfig("AM_SETTINGS_FILE",
                    this->AutogenTarget.ConfigSettingsFile);
    ofs.Write("AM_PARSE_CACHE_FILE", this->AutogenTarget.ParseCacheFile);
    ofs.WriteStrings("AM_HEADERS", headers);
    ofs.WriteStrings("AM_HEADERS_FLAGS", headersFlags);
    ofs.WriteStrings("AM_HEADERS_BUILD_PATHS", headersBuildPaths);
    ofs.WriteStrings("AM_SOURCES", sources);
    ofs.WriteStrings("AM_SOURCES_FLAGS", sourcesFlags);

    // Write moc settings
    if (this->Moc.Enabled) {
      ofs.Write("# MOC settings\n");
      ofs.WriteStrings("AM_MOC_SKIP", moc_skip);
      ofs.WriteStrings("AM_MOC_DEFINITIONS", this->Moc.Defines);
      ofs.WriteConfigStrings("AM_MOC_DEFINITIONS", this->Moc.ConfigDefines);
      ofs.WriteStrings("AM_MOC_INCLUDES", this->Moc.Includes);
      ofs.WriteConfigStrings("AM_MOC_INCLUDES", this->Moc.ConfigIncludes);
      ofs.Write("AM_MOC_OPTIONS",
                this->Target->GetSafeProperty("AUTOMOC_MOC_OPTIONS"));
      ofs.Write("AM_MOC_RELAXED_MODE", MfDef("CMAKE_AUTOMOC_RELAXED_MODE"));
      ofs.Write("AM_MOC_MACRO_NAMES",
                this->Target->GetSafeProperty("AUTOMOC_MACRO_NAMES"));
      ofs.Write("AM_MOC_DEPEND_FILTERS",
                this->Target->GetSafeProperty("AUTOMOC_DEPEND_FILTERS"));
      ofs.Write("AM_MOC_PREDEFS_CMD", this->Moc.PredefsCmd);
    }

    // Write uic settings
    if (this->Uic.Enabled) {
      // Add skipped .ui files
      uic_skip.insert(this->Uic.SkipUi.begin(), this->Uic.SkipUi.end());

      ofs.Write("# UIC settings\n");
      ofs.WriteStrings("AM_UIC_SKIP", uic_skip);
      ofs.WriteStrings("AM_UIC_TARGET_OPTIONS", this->Uic.Options);
      ofs.WriteConfigStrings("AM_UIC_TARGET_OPTIONS", this->Uic.ConfigOptions);
      ofs.WriteStrings("AM_UIC_OPTIONS_FILES", this->Uic.FileFiles);
      ofs.WriteNestedLists("AM_UIC_OPTIONS_OPTIONS", this->Uic.FileOptions);
      ofs.WriteStrings("AM_UIC_SEARCH_PATHS", this->Uic.SearchPaths);
    }
  } else {
    std::string err = "AutoGen: Could not write file ";
    err += this->AutogenTarget.InfoFile;
    cmSystemTools::Error(err);
    return false;
  }

  return true;
}